

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptr.h
# Opt level: O0

void __thiscall
ut::shared_ptr<ut::test_case_impl<agge::tests::LayoutTests>,_unsigned_int>::reset
          (shared_ptr<ut::test_case_impl<agge::tests::LayoutTests>,_unsigned_int> *this)

{
  uint uVar1;
  shared_ptr<ut::test_case_impl<agge::tests::LayoutTests>,_unsigned_int> *this_local;
  
  if ((this->_refcount != (uint *)0x0) &&
     (uVar1 = *this->_refcount - 1, *this->_refcount = uVar1, uVar1 == 0)) {
    if (this->_ptr != (test_case_impl<agge::tests::LayoutTests> *)0x0) {
      (*(this->_ptr->super_test_case).super_destructible._vptr_destructible[1])();
    }
    if (this->_refcount != (uint *)0x0) {
      operator_delete(this->_refcount);
    }
  }
  this->_ptr = (test_case_impl<agge::tests::LayoutTests> *)0x0;
  this->_refcount = (uint *)0x0;
  return;
}

Assistant:

inline void shared_ptr<T, CounterT>::reset() throw()
	{
		enum {	unused = sizeof(T)	};
		if (_refcount && !--*_refcount)
			delete _ptr, delete _refcount;
		_ptr = 0, _refcount = 0;
	}